

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool __thiscall
nlohmann::json_abi_v3_11_3::detail::
binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
::get_bson_binary<int>
          (binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
           *this,int len,binary_t *result)

{
  int iVar1;
  byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> *in_RDX;
  int in_ESI;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_RDI;
  uint8_t subtype;
  string last_token;
  binary_t *in_stack_fffffffffffffee0;
  uchar *in_stack_fffffffffffffee8;
  json_sax_t *pjVar2;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  undefined6 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff06;
  byte bVar3;
  allocator<char> in_stack_ffffffffffffff07;
  char *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  string *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff28;
  input_format_t in_stack_ffffffffffffff34;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_stack_ffffffffffffff38;
  string local_a8 [32];
  string local_88 [32];
  undefined1 local_68 [40];
  string local_40 [32];
  undefined4 in_stack_ffffffffffffffe8;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *byte_;
  int in_stack_fffffffffffffffc;
  
  if (in_ESI < 0) {
    byte_ = in_RDI;
    get_token_string((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                      *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI->chars_read
    ;
    pjVar2 = in_RDI->sax;
    std::__cxx11::to_string(in_stack_ffffffffffffff1c);
    concat<std::__cxx11::string,char_const(&)[42],std::__cxx11::string>
              ((char (*) [42])in_RDI,args_1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
               (allocator<char> *)
               CONCAT17(in_stack_ffffffffffffff07,
                        CONCAT16(in_stack_ffffffffffffff06,in_stack_ffffffffffffff00)));
    exception_message(in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,in_stack_ffffffffffffff28,
                      in_stack_ffffffffffffff20);
    parse_error::create<std::nullptr_t,_0>
              (in_stack_fffffffffffffffc,(size_t)byte_,
               (string *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX);
    iVar1 = (*(pjVar2->
              super_json_sax<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
              )._vptr_json_sax[0xc])(pjVar2,args_1,local_40,local_68);
    bVar3 = (byte)iVar1 & 1;
    parse_error::~parse_error((parse_error *)0x275f15);
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff08);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff07);
    std::__cxx11::string::~string(local_a8);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff38);
    std::__cxx11::string::~string(local_40);
  }
  else {
    bVar3 = 0;
    binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>,nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,parse_json(__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>&,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>const&,nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>&)::json_error_locator>
    ::get_number<unsigned_char,false>
              (in_RDI,(input_format_t)((ulong)in_stack_fffffffffffffef0 >> 0x20),
               in_stack_fffffffffffffee8);
    byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
    set_subtype(in_RDX,(ulong)bVar3);
    bVar3 = get_binary<int>(in_stack_fffffffffffffef0,
                            (input_format_t)((ulong)in_stack_fffffffffffffee8 >> 0x20),
                            (int)in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  }
  return (bool)(bVar3 & 1);
}

Assistant:

bool get_bson_binary(const NumberType len, binary_t& result)
    {
        if (JSON_HEDLEY_UNLIKELY(len < 0))
        {
            auto last_token = get_token_string();
            return sax->parse_error(chars_read, last_token, parse_error::create(112, chars_read,
                                    exception_message(input_format_t::bson, concat("byte array length cannot be negative, is ", std::to_string(len)), "binary"), nullptr));
        }

        // All BSON binary values have a subtype
        std::uint8_t subtype{};
        get_number<std::uint8_t>(input_format_t::bson, subtype);
        result.set_subtype(subtype);

        return get_binary(input_format_t::bson, len, result);
    }